

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barcode.h
# Opt level: O2

void __thiscall ZXing::Result::Result(Result *this)

{
  ZXing::Content::Content(&this->_content);
  (this->_error)._msg._M_dataplus._M_p = (pointer)&(this->_error)._msg.field_2;
  (this->_error)._msg._M_string_length = 0;
  (this->_error)._msg.field_2._M_local_buf[0] = '\0';
  (this->_error)._file = (char *)0x0;
  (this->_error)._line = -1;
  (this->_error)._type = None;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
  ReaderOptions::ReaderOptions(&this->_readerOpts);
  (this->_sai).index = -1;
  (this->_sai).count = -1;
  (this->_sai).id._M_dataplus._M_p = (pointer)&(this->_sai).id.field_2;
  (this->_sai).id._M_string_length = 0;
  (this->_sai).id.field_2._M_local_buf[0] = '\0';
  this->_format = None;
  this->_ecLevel[0] = '\0';
  this->_ecLevel[1] = '\0';
  this->_ecLevel[2] = '\0';
  this->_ecLevel[3] = '\0';
  this->_version[0] = '\0';
  this->_version[1] = '\0';
  this->_version[2] = '\0';
  this->_version[3] = '\0';
  this->_lineCount = 0;
  *(undefined4 *)((long)&this->_lineCount + 3) = 0;
  return;
}

Assistant:

Result() = default;